

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *this_00;
  string *s;
  string *current;
  Arena *arena_local;
  string *value_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  bVar1 = IsDefault(this,default_value);
  if (bVar1) {
    if (arena == (Arena *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
      std::__cxx11::string::string((string *)pbVar2,(string *)value);
      TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Set(&this->tagged_ptr_,pbVar2);
    }
    else {
      pbVar2 = Arena::Create<std::__cxx11::string,std::__cxx11::string>(arena,value);
      TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Set(&this->tagged_ptr_,pbVar2);
    }
  }
  else {
    bVar1 = IsDonatedString(this);
    if (bVar1) {
      pbVar2 = TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(&this->tagged_ptr_);
      std::__cxx11::string::string((string *)pbVar2,(string *)value);
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ThreadSafeArena::AddCleanup
                  ((ThreadSafeArena *)arena,pbVar2,arena_destruct_object<std::__cxx11::string>);
      }
      TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Set(&this->tagged_ptr_,pbVar2);
    }
    else {
      this_00 = UnsafeMutablePointer_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)this_00,(string *)value);
    }
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value, std::string&& value,
                         ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    if (arena == nullptr) {
      tagged_ptr_.Set(new std::string(std::move(value)));
    } else {
      tagged_ptr_.Set(Arena::Create<std::string>(arena, std::move(value)));
    }
  } else if (IsDonatedString()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.Set(s);
  } else /* !IsDonatedString() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}